

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetHistogramBinFunction<duckdb::HistogramExact>
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType *this;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  initializer_list<duckdb::LogicalType> __l_09;
  initializer_list<duckdb::LogicalType> __l_10;
  initializer_list<duckdb::LogicalType> __l_11;
  allocator_type local_d2;
  allocator local_d1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d0;
  LogicalType local_b8;
  LogicalType local_a0 [2];
  string local_70;
  LogicalType local_50;
  LogicalType struct_type;
  
  if (type->id_ == DECIMAL) {
    LogicalType::LogicalType(local_a0,DOUBLE);
    GetHistogramBinFunction<duckdb::HistogramExact>(__return_storage_ptr__,local_a0);
    this = local_a0;
    goto LAB_01d5e4a2;
  }
  switch(type->physical_type_) {
  case BOOL:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l._M_len = 2;
    __l._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<bool>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<bool>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,bool,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<bool>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,bool>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<bool>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case UINT8:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_09._M_len = 2;
    __l_09._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_09,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<unsigned_char>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<unsigned_char>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramFunctor,unsigned_char,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<unsigned_char>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_char>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<unsigned_char>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case INT8:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_05._M_len = 2;
    __l_05._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_05,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<signed_char>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<signed_char>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramFunctor,signed_char,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<signed_char>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,signed_char>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<signed_char>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case UINT16:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_04._M_len = 2;
    __l_04._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_04,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<unsigned_short>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<unsigned_short>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramFunctor,unsigned_short,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<unsigned_short>,duckdb::HistogramBinFunction>
               ,HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_short>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<unsigned_short>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case INT16:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_07._M_len = 2;
    __l_07._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_07,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<short>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<short>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,short,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<short>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,short>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<short>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case UINT32:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_03._M_len = 2;
    __l_03._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_03,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<unsigned_int>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<unsigned_int>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<unsigned_int>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_int>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<unsigned_int>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case INT32:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_02._M_len = 2;
    __l_02._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_02,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<int>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<int>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,int,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<int>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,int>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<int>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case UINT64:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_06._M_len = 2;
    __l_06._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_06,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<unsigned_long>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<unsigned_long>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramFunctor,unsigned_long,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<unsigned_long>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_long>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<unsigned_long>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case INT64:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_11._M_len = 2;
    __l_11._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_11,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<long>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<long>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,long,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<long>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,long>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<long>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case UINT64|UINT8:
switchD_01d5d41d_caseD_a:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_01._M_len = 2;
    __l_01._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_01,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,
               AggregateFunction::StateSize<duckdb::HistogramBinState<duckdb::string_t>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               ,HistogramBinFinalizeFunction<duckdb::HistogramGenericFunctor,duckdb::string_t>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case FLOAT:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_10._M_len = 2;
    __l_10._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_10,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<float>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<float>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,float,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<float>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,float>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<float>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  case DOUBLE:
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_08._M_len = 2;
    __l_08._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_08,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,AggregateFunction::StateSize<duckdb::HistogramBinState<double>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<double>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,HistogramBinUpdateFunction<duckdb::HistogramFunctor,double,duckdb::HistogramExact>,
               AggregateFunction::
               StateCombine<duckdb::HistogramBinState<double>,duckdb::HistogramBinFunction>,
               HistogramBinFinalizeFunction<duckdb::HistogramFunctor,double>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<double>,duckdb::HistogramBinFunction>,
               (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    break;
  default:
    if (type->physical_type_ != VARCHAR) goto switchD_01d5d41d_caseD_a;
    LogicalType::LogicalType(&local_50,type);
    LogicalType::LogicalType(&local_b8,UBIGINT);
    LogicalType::MAP(&struct_type,&local_50,&local_b8);
    LogicalType::~LogicalType(&local_b8);
    LogicalType::~LogicalType(&local_50);
    ::std::__cxx11::string::string((string *)&local_70,"histogram_exact",&local_d1);
    LogicalType::LogicalType(local_a0,type);
    LogicalType::LIST(local_a0 + 1,type);
    __l_00._M_len = 2;
    __l_00._M_array = local_a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_d0,__l_00,&local_d2);
    AggregateFunction::AggregateFunction
              (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_d0,
               &struct_type,
               AggregateFunction::StateSize<duckdb::HistogramBinState<duckdb::string_t>>,
               AggregateFunction::
               StateInitialize<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction,(duckdb::AggregateDestructorType)0>
               ,
               HistogramBinUpdateFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::HistogramExact>
               ,AggregateFunction::
                StateCombine<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               ,HistogramBinFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t>,
               (aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::HistogramBinState<duckdb::string_t>,duckdb::HistogramBinFunction>
               ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    lVar1 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_a0[0].id_ + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
  }
  ::std::__cxx11::string::~string((string *)&local_70);
  this = &struct_type;
LAB_01d5e4a2:
  LogicalType::~LogicalType(this);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetHistogramBinFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::DECIMAL) {
		return GetHistogramBinFunction<HIST>(LogicalType::DOUBLE);
	}
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
		return GetHistogramBinFunction<HistogramFunctor, bool, HIST>(type);
	case PhysicalType::UINT8:
		return GetHistogramBinFunction<HistogramFunctor, uint8_t, HIST>(type);
	case PhysicalType::UINT16:
		return GetHistogramBinFunction<HistogramFunctor, uint16_t, HIST>(type);
	case PhysicalType::UINT32:
		return GetHistogramBinFunction<HistogramFunctor, uint32_t, HIST>(type);
	case PhysicalType::UINT64:
		return GetHistogramBinFunction<HistogramFunctor, uint64_t, HIST>(type);
	case PhysicalType::INT8:
		return GetHistogramBinFunction<HistogramFunctor, int8_t, HIST>(type);
	case PhysicalType::INT16:
		return GetHistogramBinFunction<HistogramFunctor, int16_t, HIST>(type);
	case PhysicalType::INT32:
		return GetHistogramBinFunction<HistogramFunctor, int32_t, HIST>(type);
	case PhysicalType::INT64:
		return GetHistogramBinFunction<HistogramFunctor, int64_t, HIST>(type);
	case PhysicalType::FLOAT:
		return GetHistogramBinFunction<HistogramFunctor, float, HIST>(type);
	case PhysicalType::DOUBLE:
		return GetHistogramBinFunction<HistogramFunctor, double, HIST>(type);
	case PhysicalType::VARCHAR:
		return GetHistogramBinFunction<HistogramStringFunctor, string_t, HIST>(type);
#endif
	default:
		return GetHistogramBinFunction<HistogramGenericFunctor, string_t, HIST>(type);
	}
}